

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::PathTypeHandlerBase::ProcessFixedFieldChange
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyIndex slotIndex,Var value,bool isNonFixed,PropertyRecord *propertyRecord)

{
  TypePath *pTVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  ushort uVar6;
  BOOL BVar7;
  DynamicTypeHandler *pDVar8;
  undefined4 *puVar9;
  PathTypeHandlerBase *this_00;
  
  pDVar8 = DynamicObject::GetTypeHandler(instance);
  if ((pDVar8->flags & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xc52,"(!instance->GetTypeHandler()->GetIsShared())",
                                "!instance->GetTypeHandler()->GetIsShared()");
    if (!bVar4) goto LAB_00c48e56;
    *puVar9 = 0;
  }
  BVar7 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
  if (BVar7 != 0 && !isNonFixed) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xc55,"(!instance->IsExternal() || isNonFixed)",
                                "!instance->IsExternal() || isNonFixed");
    if (!bVar4) goto LAB_00c48e56;
    *puVar9 = 0;
  }
  if (DAT_0145c381 != '\x01') {
    return true;
  }
  this_00 = (PathTypeHandlerBase *)DynamicObject::GetTypeHandler(instance);
  uVar6 = (ushort)((((this_00->typePath).ptr)->data).ptr)->maxInitializedLength;
  if (slotIndex < uVar6) {
    InvalidateFixedFieldAt
              (this_00,propertyId,slotIndex,
               (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
    pTVar1 = (this_00->typePath).ptr;
    if (((slotIndex + 1 == (uint)((pTVar1->data).ptr)->maxInitializedLength) &&
        (pRVar2 = (pTVar1->singletonInstance).ptr,
        pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0)) &&
       ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef != instance)) {
      bVar4 = HasSingletonInstanceOnlyIfNeeded(this_00);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xc8e,"(newTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                    "newTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
        if (!bVar4) goto LAB_00c48e56;
        *puVar9 = 0;
      }
      (((this_00->typePath).ptr)->singletonInstance).ptr =
           (RecyclerWeakReference<Js::DynamicObject> *)0x0;
    }
  }
  else {
    if (uVar6 != slotIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xc65,
                                  "(slotIndex == newTypeHandler->GetTypePath()->GetMaxInitializedLength())"
                                  ,"Adding properties out of order?");
      if (!bVar4) goto LAB_00c48e56;
      *puVar9 = 0;
    }
    bVar4 = DynamicTypeHandler::ShouldFixAnyProperties();
    if ((bVar4) && (bVar4 = DynamicTypeHandler::CanBeSingletonInstance(instance), bVar4)) {
      if ((uint)propertyId < 0x10 || isNonFixed) {
LAB_00c48ce6:
        bVar4 = false;
      }
      else {
        bVar4 = VarIs<Js::JavascriptFunction>(value);
        if (bVar4) {
          bVar4 = true;
          bVar5 = DynamicTypeHandler::ShouldFixMethodProperties();
          if (!bVar5) {
            bVar4 = DynamicTypeHandler::ShouldFixAccessorProperties();
          }
        }
        else {
          bVar4 = DynamicTypeHandler::ShouldFixDataProperties();
          if (!bVar4) goto LAB_00c48ce6;
          bVar4 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                            (instance,propertyRecord,propertyId,value);
        }
      }
      TypePath::AddSingletonInstanceFieldAt
                ((this_00->typePath).ptr,instance,slotIndex,bVar4,
                 (uint)((this_00->super_DynamicTypeHandler).unusedBytes >> 1));
    }
    else {
      TypePath::AddSingletonInstanceFieldAt
                ((this_00->typePath).ptr,slotIndex,
                 (uint)((this_00->super_DynamicTypeHandler).unusedBytes >> 1));
    }
  }
  pTVar1 = (this->typePath).ptr;
  pRVar2 = (pTVar1->singletonInstance).ptr;
  if (((pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
      ((this_00->typePath).ptr != pTVar1)) &&
     ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef == instance)) {
    if ((this->super_DynamicTypeHandler).unusedBytes >> 1 <
        (ushort)((pTVar1->data).ptr)->maxInitializedLength) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xc9a,
                                  "(GetPathLength() >= this->GetTypePath()->GetMaxInitializedLength())"
                                  ,
                                  "GetPathLength() >= this->GetTypePath()->GetMaxInitializedLength()"
                                 );
      if (!bVar4) goto LAB_00c48e56;
      *puVar9 = 0;
    }
    bVar4 = HasSingletonInstanceOnlyIfNeeded(this);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xc9b,"(HasSingletonInstanceOnlyIfNeeded())",
                                  "HasSingletonInstanceOnlyIfNeeded()");
      if (!bVar4) {
LAB_00c48e56:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
    (((this->typePath).ptr)->singletonInstance).ptr =
         (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  }
  return slotIndex < uVar6;
}

Assistant:

bool PathTypeHandlerBase::ProcessFixedFieldChange(DynamicObject* instance, PropertyId propertyId, PropertyIndex slotIndex, Var value, bool isNonFixed,const PropertyRecord * propertyRecord)
    {
        Assert(!instance->GetTypeHandler()->GetIsShared());
        // We don't want fixed properties on external objects, either external properties or expando properties.
        // See DynamicObject::ResetObject for more information.
        Assert(!instance->IsExternal() || isNonFixed);

        if (!FixPropsOnPathTypes())
        {
            return true;
        }

        bool populateInlineCache = true;

        PathTypeHandlerBase* newTypeHandler = (PathTypeHandlerBase*)instance->GetTypeHandler();

        if (slotIndex >= newTypeHandler->GetTypePath()->GetMaxInitializedLength())
        {
            // We are adding a property where no instance property has been set before.  We rely on properties being
            // added in order of indexes to be sure that we don't leave any uninitialized properties interspersed with
            // initialized ones, which could lead to incorrect behavior.  See comment in TypePath::Branch.
            AssertMsg(slotIndex == newTypeHandler->GetTypePath()->GetMaxInitializedLength(), "Adding properties out of order?");

            // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to
            // undefined or even some other special illegal value (for let or const, currently == null)
            // Assert(instance->GetSlot(index) == nullptr);

            if (ShouldFixAnyProperties() && CanBeSingletonInstance(instance))
            {
                bool markAsFixed = !isNonFixed && !IsInternalPropertyId(propertyId) &&
                    (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() || ShouldFixAccessorProperties() :
                                    (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyRecord, propertyId, value)));

                // Mark the newly added field as fixed and prevent population of inline caches.

                newTypeHandler->GetTypePath()->AddSingletonInstanceFieldAt(instance, slotIndex, markAsFixed, newTypeHandler->GetPathLength());
            }
            else
            {
                newTypeHandler->GetTypePath()->AddSingletonInstanceFieldAt(slotIndex, newTypeHandler->GetPathLength());
            }

            populateInlineCache = false;
        }
        else
        {
            newTypeHandler->InvalidateFixedFieldAt(propertyId, slotIndex, instance->GetScriptContext());

            // We have now reached the most advanced instance along this path.  If this instance is not the singleton instance,
            // then the former singleton instance (if any) is no longer a singleton.  This instance could be the singleton
            // instance, if we just happen to set (overwrite) its last property.
            if (slotIndex + 1 == newTypeHandler->GetTypePath()->GetMaxInitializedLength())
            {
                // If we cleared the singleton instance while some fields remained fixed, the instance would
                // be collectible, and yet some code would expect to see values and call methods on it. We rely on the
                // fact that we always add properties to (pre-initialized) type handlers in the order they appear
                // on the type path.  By the time we reach the singleton instance, all fixed fields will have been invalidated.
                // Otherwise, some fields could remain fixed (or even uninitialized) and we would have to spin off a loop here
                // to invalidate any remaining fixed fields
                auto singletonWeakRef = newTypeHandler->GetTypePath()->GetSingletonInstance();
                if (singletonWeakRef != nullptr && instance != singletonWeakRef->Get())
                {
                    Assert(newTypeHandler->HasSingletonInstanceOnlyIfNeeded());
                    newTypeHandler->GetTypePath()->ClearSingletonInstance();
                }
            }
        }

        // If we branched and this is the singleton instance, we need to remove it from this type handler.  The only time
        // this can happen is when another not fully initialized instance is ahead of this one on the current path.
        auto singletonWeakRef = this->GetTypePath()->GetSingletonInstance();
        if (newTypeHandler->GetTypePath() != this->GetTypePath() && singletonWeakRef != nullptr && singletonWeakRef->Get() == instance)
        {
            // If this is the singleton instance, there shouldn't be any other initialized instance ahead of it on the old path.
            Assert(GetPathLength() >= this->GetTypePath()->GetMaxInitializedLength());
            Assert(HasSingletonInstanceOnlyIfNeeded());
            this->GetTypePath()->ClearSingletonInstance();
        }

        return populateInlineCache;
    }